

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_pattern_mbs(archive_match *a,match_list *list,char *pattern)

{
  match *m;
  char *mbs;
  char *in_RDX;
  match_list *in_RSI;
  long in_RDI;
  size_t len;
  match *match;
  size_t in_stack_ffffffffffffffc8;
  wchar_t local_4;
  
  m = (match *)calloc(1,0x78);
  if (m == (match *)0x0) {
    local_4 = error_nomem((archive_match *)0x11b209);
  }
  else {
    mbs = (char *)strlen(in_RDX);
    if ((mbs != (char *)0x0) && (in_RDX[(long)(mbs + -1)] == '/')) {
      mbs = mbs + -1;
    }
    archive_mstring_copy_mbs_len((archive_mstring *)m,mbs,in_stack_ffffffffffffffc8);
    match_list_add(in_RSI,m);
    *(uint *)(in_RDI + 0x70) = *(uint *)(in_RDI + 0x70) | 1;
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
add_pattern_mbs(struct archive_match *a, struct match_list *list,
    const char *pattern)
{
	struct match *match;
	size_t len;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	/* Both "foo/" and "foo" should match "foo/bar". */
	len = strlen(pattern);
	if (len && pattern[len - 1] == '/')
		--len;
	archive_mstring_copy_mbs_len(&(match->pattern), pattern, len);
	match_list_add(list, match);
	a->setflag |= PATTERN_IS_SET;
	return (ARCHIVE_OK);
}